

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O2

bool __thiscall cmParseDelphiCoverage::HTMLParser::ParseFile(HTMLParser *this,char *file)

{
  cmCTest *pcVar1;
  key_type *__k;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  mapped_type *coverageVector;
  char cVar7;
  bool bVar8;
  string filename;
  Glob gl;
  char *local_2f8 [4];
  string glob;
  string filelineoffset;
  string lineresult;
  string line;
  string lastroutine;
  ifstream in;
  byte abStack_218 [488];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,file,(allocator<char> *)&in);
  lineresult._M_dataplus._M_p = (pointer)&lineresult.field_2;
  lineresult._M_string_length = 0;
  lastroutine._M_dataplus._M_p = (pointer)&lastroutine.field_2;
  lastroutine._M_string_length = 0;
  lineresult.field_2._M_local_buf[0] = '\0';
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filelineoffset._M_dataplus._M_p = (pointer)&filelineoffset.field_2;
  filelineoffset._M_string_length = 0;
  lastroutine.field_2._M_local_buf[0] = '\0';
  filename.field_2._M_local_buf[0] = '\0';
  filelineoffset.field_2._M_local_buf[0] = '\0';
  do {
    cVar7 = (char)&line;
    lVar4 = std::__cxx11::string::find(cVar7,0x28);
    if (lVar4 == -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&in);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&in);
      poVar5 = std::operator<<(poVar5,"File not found  ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseDelphiCoverage.cxx"
                   ,0x72,(char *)gl.Internals,this->Coverage->Quiet);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&in);
      bVar8 = false;
      goto LAB_00171bc8;
    }
    std::__cxx11::string::find(cVar7,0x29);
    std::__cxx11::string::substr((ulong)&in,(ulong)&line);
    std::__cxx11::string::operator=((string *)&filename,(string *)&in);
    std::__cxx11::string::~string((string *)&in);
    lVar4 = std::__cxx11::string::find((char *)&filename,0x4994d4);
  } while (lVar4 == -1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in);
  poVar5 = std::operator<<((ostream *)&in,"Coverage found for file:  ");
  poVar5 = std::operator<<(poVar5,(string *)&filename);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseDelphiCoverage.cxx"
               ,0x7b,(char *)gl.Internals,this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&in);
  cmsys::Glob::Glob(&gl);
  gl.Recurse = true;
  gl.RecurseThroughSymlinks = false;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                 &this->Coverage->SourceDir,"*/");
  std::operator+(&glob,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                 &filename);
  std::__cxx11::string::~string((string *)&in);
  cmsys::Glob::FindFiles(&gl,&glob,(GlobMessages *)0x0);
  pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
  __k = (pvVar6->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (__k == (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&in);
    poVar5 = std::operator<<((ostream *)&in,"Unable to find file matching");
    poVar5 = std::operator<<(poVar5,(string *)&glob);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseDelphiCoverage.cxx"
                 ,0x91,local_2f8[0],this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&in);
    bVar8 = false;
  }
  else {
    coverageVector =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::operator[](&this->Coverage->TotalCoverage,__k);
    initializeDelphiFile
              (this,(pvVar6->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,coverageVector);
    std::ifstream::ifstream(&in,file,_S_in);
    bVar8 = (abStack_218[*(long *)(_in + -0x18)] & 5) == 0;
    if (bVar8) {
      while( true ) {
        bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&in,&line,(bool *)0x0,-1);
        if (!bVar2) break;
        lVar4 = std::__cxx11::string::find((char *)&line,0x499511);
        if (lVar4 != -1) {
          std::__cxx11::string::find((char *)&line,0x499518);
          cVar7 = (char)&line;
          std::__cxx11::string::find(cVar7,0x3e);
          std::__cxx11::string::substr((ulong)local_2f8,(ulong)&line);
          std::__cxx11::string::operator=((string *)&lineresult,(string *)local_2f8);
          std::__cxx11::string::~string((string *)local_2f8);
          bVar2 = std::operator==(&lineresult,"covered");
          if (bVar2) {
            std::__cxx11::string::find(cVar7,0x3c);
            std::__cxx11::string::substr((ulong)local_2f8,(ulong)&line);
            std::__cxx11::string::operator=((string *)&filelineoffset,(string *)local_2f8);
            std::__cxx11::string::~string((string *)local_2f8);
            iVar3 = atoi(filelineoffset._M_dataplus._M_p);
            (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)iVar3 + -1] = 1;
          }
        }
      }
    }
    std::ifstream::~ifstream(&in);
  }
  std::__cxx11::string::~string((string *)&glob);
  cmsys::Glob::~Glob(&gl);
LAB_00171bc8:
  std::__cxx11::string::~string((string *)&filelineoffset);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&lastroutine);
  std::__cxx11::string::~string((string *)&lineresult);
  std::__cxx11::string::~string((string *)&line);
  return bVar8;
}

Assistant:

bool ParseFile(const char* file)
  {
    std::string line = file;
    std::string lineresult;
    std::string lastroutine;
    std::string filename;
    std::string filelineoffset;
    size_t afterLineNum = 0;
    size_t lastoffset = 0;
    size_t endcovpos = 0;
    size_t endnamepos = 0;
    size_t pos = 0;

    /*
     *  This first 'while' section goes through the found HTML
     *  file name and attempts to capture the source file name
     *   which is set as part of the HTML file name: the name of
     *   the file is found in parenthesis '()'
     *
     *   See test HTML file name: UTCovTest(UTCovTest.pas).html.
     *
     *   Find the text inside each pair of parenthesis and check
     *   to see if it ends in '.pas'.  If it can't be found,
     *   exit the function.
     */
    while (true) {
      lastoffset = line.find('(', pos);
      if (lastoffset == std::string::npos) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           endnamepos << "File not found  " << lastoffset
                                      << std::endl,
                           this->Coverage.Quiet);
        return false;
      }
      endnamepos = line.find(')', lastoffset);
      filename = line.substr(lastoffset + 1, (endnamepos - 1) - lastoffset);
      if (filename.find(".pas") != std::string::npos) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Coverage found for file:  " << filename
                                                        << std::endl,
                           this->Coverage.Quiet);
        break;
      }
      pos = lastoffset + 1;
    }
    /*
     *  Glob through the source directory for the
     *  file found above
     */
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOff();
    std::string glob = Coverage.SourceDir + "*/" + filename;
    gl.FindFiles(glob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      /*
       *  If that doesn't find any matching files
       *  return a failure.
       */
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Unable to find file matching" << glob << std::endl,
                         this->Coverage.Quiet);
      return false;
    }
    FileLinesType& coverageVector = this->Coverage.TotalCoverage[files[0]];

    /*
     *  Initialize the file to have all code between 'begin' and
     *  'end' tags marked as executable
     */

    this->initializeDelphiFile(files[0], coverageVector);

    cmsys::ifstream in(file);
    if (!in) {
      return false;
    }

    /*
     *  Now read the HTML file, looking for the lines that have an
     *  "inline" in it. Then parse out the "class" value of that
     *  line to determine if the line is executed or not.
     *
     *  Sample HTML line:
     *
     *  <tr class="covered"><td>47</td><td><pre style="display:inline;">
     *    &nbsp;CheckEquals(1,2-1);</pre></td></tr>
     *
     */

    while (cmSystemTools::GetLineFromStream(in, line)) {
      if (line.find("inline") == std::string::npos) {
        continue;
      }

      lastoffset = line.find("class=");
      endcovpos = line.find('>', lastoffset);
      lineresult = line.substr(lastoffset + 7, (endcovpos - 8) - lastoffset);

      if (lineresult == "covered") {
        afterLineNum = line.find('<', endcovpos + 5);
        filelineoffset =
          line.substr(endcovpos + 5, afterLineNum - (endcovpos + 5));
        coverageVector[atoi(filelineoffset.c_str()) - 1] = 1;
      }
    }
    return true;
  }